

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O0

void botpOCRAStepR(char *otp,octet *q,size_t q_len,tm_time_t t,void *state)

{
  octet *ctr;
  octet *src;
  size_t sVar1;
  octet *count;
  char *in_RCX;
  octet *in_R8;
  botp_ocra_st *st;
  octet *digit;
  
  ctr = in_R8 + 0x33a;
  src = in_R8 + 0x33a;
  digit = in_R8;
  sVar1 = beltHMAC_keep();
  count = src + sVar1;
  beltHMAC_keep();
  memCopy(ctr,src,0x16c345);
  if (*(long *)(in_R8 + 0x18) != 0) {
    beltHMACStepA(in_R8,(size_t)count,ctr);
    botpCtrNext(in_R8 + 8);
  }
  memMove(ctr,src,0x16c396);
  memSet(ctr,(octet)((ulong)src >> 0x38),0x16c3b5);
  beltHMACStepA(in_R8,(size_t)count,ctr);
  if (*(long *)(in_R8 + 0xf0) != 0) {
    beltHMACStepA(in_R8,(size_t)count,ctr);
  }
  if (*(long *)(in_R8 + 0x2f8) != 0) {
    beltHMACStepA(in_R8,(size_t)count,ctr);
  }
  if (*(long *)(in_R8 + 0x308) != 0) {
    botpTimeToCtr(ctr,(tm_time_t)src);
    beltHMACStepA(in_R8,(size_t)count,ctr);
  }
  beltHMACStepG(ctr,src);
  botpDT(in_RCX,(size_t)digit,in_R8,(size_t)count);
  return;
}

Assistant:

void botpOCRAStepR(char* otp, const octet q[], size_t q_len, tm_time_t t, 
	void* state)
{
	botp_ocra_st* st = (botp_ocra_st*)state;
	// pre
	ASSERT(memIsDisjoint2(otp, st->digit + 1, state, botpOCRA_keep()) || 
		otp == st->otp);
	ASSERT(4 <= q_len && q_len <= 2 * st->q_max);
	ASSERT(memIsDisjoint2(q, q_len, state, botpOCRA_keep() || q == st->q));
	ASSERT(t != TIME_ERR);
	// вычислить имитовставку
	memCopy(st->stack, st->stack + beltHMAC_keep(), beltHMAC_keep());
	if (st->ctr_len)
		beltHMACStepA(st->ctr, 8, st->stack), botpCtrNext(st->ctr);
	memMove(st->q, q, q_len);
	memSetZero(st->q + q_len, 128 - q_len);
	beltHMACStepA(st->q, 128, st->stack);
	if (st->p_len)
		beltHMACStepA(st->p, st->p_len, st->stack);
	if (st->s_len)
		beltHMACStepA(st->s, st->s_len, st->stack);
	if (st->ts)
		botpTimeToCtr(st->t, t), beltHMACStepA(st->t, 8, st->stack);
	beltHMACStepG(st->mac, st->stack);
	// построить пароль
	botpDT(otp, st->digit, st->mac, 32);
}